

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O2

void MpiProvideTimeStep(CP_Services Svcs,DP_WS_Stream Stream_v,_SstData *Data,
                       _SstData *LocalMetadata,size_t TimeStep,void **TimeStepInfoPtr)

{
  char *pcVar1;
  size_t *psVar2;
  size_t *psVar3;
  
  psVar2 = (size_t *)calloc(0x18,1);
  psVar3 = (size_t *)malloc(0x10);
  psVar2[1] = (size_t)psVar3;
  pcVar1 = Data->block;
  *psVar3 = Data->DataSize;
  psVar3[1] = (size_t)pcVar1;
  *psVar2 = TimeStep;
  pthread_rwlock_wrlock((pthread_rwlock_t *)((long)Stream_v + 0x40));
  **(undefined8 **)((long)Stream_v + 0x28) = psVar2;
  *(size_t **)((long)Stream_v + 0x28) = psVar2 + 2;
  pthread_rwlock_unlock((pthread_rwlock_t *)((long)Stream_v + 0x40));
  return;
}

Assistant:

static void MpiProvideTimeStep(CP_Services Svcs, DP_WS_Stream Stream_v, struct _SstData *Data,
                               struct _SstData *LocalMetadata, size_t TimeStep,
                               void **TimeStepInfoPtr)
{
    MpiStreamWR Stream = (MpiStreamWR)Stream_v;
    TimeStepsEntry Entry = calloc(sizeof(struct _TimeStepsEntry), 1);

    Entry->Data = malloc(sizeof(struct _SstData));
    memcpy(Entry->Data, Data, sizeof(struct _SstData));
    Entry->TimeStep = TimeStep;

    pthread_rwlock_wrlock(&Stream->LockTS);
    STAILQ_INSERT_TAIL(&Stream->TimeSteps, Entry, entries);
    pthread_rwlock_unlock(&Stream->LockTS);
}